

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_matcher.cpp
# Opt level: O3

bool __thiscall
duckdb::ExpressionMatcher::Match
          (ExpressionMatcher *this,Expression *expr,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings)

{
  pointer *pprVar1;
  iterator __position;
  int iVar2;
  pointer pTVar3;
  pointer pEVar4;
  reference_wrapper<duckdb::Expression> local_20;
  
  if ((this->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
      _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
      super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl != (TypeMatcher *)0x0) {
    pTVar3 = unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::
             operator->(&this->type);
    iVar2 = (*pTVar3->_vptr_TypeMatcher[2])(pTVar3,&expr->return_type);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  if ((this->expr_type).
      super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl !=
      (ExpressionTypeMatcher *)0x0) {
    pEVar4 = unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true>
             ::operator->(&this->expr_type);
    iVar2 = (*pEVar4->_vptr_ExpressionTypeMatcher[2])
                      (pEVar4,(ulong)(expr->super_BaseExpression).type);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  if ((this->expr_class != INVALID) &&
     (this->expr_class != (expr->super_BaseExpression).expression_class)) {
    return false;
  }
  __position._M_current =
       (bindings->
       super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (bindings->
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20._M_data = expr;
    ::std::
    vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::Expression>>
              ((vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                *)bindings,__position,&local_20);
  }
  else {
    (__position._M_current)->_M_data = expr;
    pprVar1 = &(bindings->
               super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return true;
}

Assistant:

bool ExpressionMatcher::Match(Expression &expr, vector<reference<Expression>> &bindings) {
	if (type && !type->Match(expr.return_type)) {
		return false;
	}
	if (expr_type && !expr_type->Match(expr.GetExpressionType())) {
		return false;
	}
	if (expr_class != ExpressionClass::INVALID && expr_class != expr.GetExpressionClass()) {
		return false;
	}
	bindings.push_back(expr);
	return true;
}